

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html_display_driver.cpp
# Opt level: O0

void __thiscall HtmlDisplayDriver::display(HtmlDisplayDriver *this,Document *doc,ostream *output)

{
  size_t sVar1;
  Paragraph *pPVar2;
  undefined4 uVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  long local_118;
  UrlLineElement *local_108;
  CodeLineElement *local_f8;
  ItalicLineElement *local_e8;
  string local_b8 [48];
  string local_88 [32];
  ulong local_68;
  size_t j;
  size_t i;
  bool is_olist;
  bool is_ulist;
  bool is_quotation;
  long lStack_50;
  bool is_verbatim;
  UrlLineElement *url_le;
  CodeLineElement *code_le;
  ItalicLineElement *italic_le;
  BoldLineElement *bold_le;
  LineElement *l;
  Paragraph *p;
  ostream *output_local;
  Document *doc_local;
  HtmlDisplayDriver *this_local;
  
  l = (LineElement *)0x0;
  bold_le = (BoldLineElement *)0x0;
  italic_le = (ItalicLineElement *)0x0;
  code_le = (CodeLineElement *)0x0;
  url_le = (UrlLineElement *)0x0;
  lStack_50 = 0;
  i._7_1_ = 0;
  i._6_1_ = 0;
  i._5_1_ = 0;
  i._4_1_ = 0;
  p = (Paragraph *)output;
  output_local = (ostream *)doc;
  doc_local = (Document *)this;
  if ((this->field_0x8 & 1) != 0) {
    poVar5 = std::operator<<(output,"<!doctype html>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)p,"<html lang=\"fr\">");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)p,"<head>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)p,"<meta charset=\"utf-8\">");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)p,"<title>mdl generated HTML page</title>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)p,"</head>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)p,"<body>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  for (j = 0; sVar1 = j, uVar6 = Document::size(), sVar1 < uVar6; j = j + 1) {
    l = (LineElement *)Document::operator[]((ulong)output_local);
    uVar3 = (**(code **)(*(long *)l + 8))();
    switch(uVar3) {
    case 1:
      std::operator<<((ostream *)p,"<h1>");
      break;
    case 2:
      std::operator<<((ostream *)p,"<h2>");
      break;
    case 3:
      std::operator<<((ostream *)p,"<h3>");
      break;
    default:
      poVar5 = std::operator<<((ostream *)p,"<p>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      break;
    case 7:
      if ((i._4_1_ & 1) == 0) {
        poVar5 = std::operator<<((ostream *)p,"<ol>");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        i._4_1_ = 1;
      }
      std::operator<<((ostream *)p,"<li>");
      break;
    case 8:
      if ((i._5_1_ & 1) == 0) {
        poVar5 = std::operator<<((ostream *)p,"<ul>");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        i._5_1_ = 1;
      }
      std::operator<<((ostream *)p,"<li>");
      break;
    case 10:
      if ((i._6_1_ & 1) == 0) {
        poVar5 = std::operator<<((ostream *)p,"<blockquote>");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        i._6_1_ = 1;
      }
      break;
    case 0xb:
      if ((i._7_1_ & 1) == 0) {
        poVar5 = std::operator<<((ostream *)p,"<code>");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        i._7_1_ = 1;
      }
    }
    for (local_68 = 0; uVar6 = local_68, uVar7 = Paragraph::size(), uVar6 < uVar7;
        local_68 = local_68 + 1) {
      bold_le = (BoldLineElement *)Paragraph::operator[]((ulong)l);
      if (bold_le == (BoldLineElement *)0x0) {
        local_e8 = (ItalicLineElement *)0x0;
      }
      else {
        local_e8 = (ItalicLineElement *)
                   __dynamic_cast(bold_le,&LineElement::typeinfo,&BoldLineElement::typeinfo,0);
      }
      italic_le = local_e8;
      if (bold_le == (BoldLineElement *)0x0) {
        local_f8 = (CodeLineElement *)0x0;
      }
      else {
        local_f8 = (CodeLineElement *)
                   __dynamic_cast(bold_le,&LineElement::typeinfo,&ItalicLineElement::typeinfo,0);
      }
      code_le = local_f8;
      if (bold_le == (BoldLineElement *)0x0) {
        local_108 = (UrlLineElement *)0x0;
      }
      else {
        local_108 = (UrlLineElement *)
                    __dynamic_cast(bold_le,&LineElement::typeinfo,&CodeLineElement::typeinfo,0);
      }
      url_le = local_108;
      if (bold_le == (BoldLineElement *)0x0) {
        local_118 = 0;
      }
      else {
        local_118 = __dynamic_cast(bold_le,&LineElement::typeinfo,&UrlLineElement::typeinfo,0);
      }
      lStack_50 = local_118;
      if (code_le == (CodeLineElement *)0x0) {
        if (italic_le == (ItalicLineElement *)0x0) {
          if ((url_le == (UrlLineElement *)0x0) ||
             (iVar4 = (**(code **)(*(long *)l + 8))(), iVar4 == 0xb)) {
            if (lStack_50 != 0) {
              poVar5 = std::operator<<((ostream *)p,"<a href=\"");
              UrlLineElement::url_abi_cxx11_();
              poVar5 = std::operator<<(poVar5,local_88);
              std::operator<<(poVar5,"\">");
              std::__cxx11::string::~string(local_88);
            }
          }
          else {
            std::operator<<((ostream *)p,"<code>");
          }
        }
        else {
          std::operator<<((ostream *)p,"<b>");
        }
      }
      else {
        std::operator<<((ostream *)p,"<i>");
      }
      pPVar2 = p;
      (**(code **)(*(long *)bold_le + 0x10))();
      std::operator<<((ostream *)pPVar2,local_b8);
      std::__cxx11::string::~string(local_b8);
      if (lStack_50 == 0) {
        if (italic_le == (ItalicLineElement *)0x0) {
          if (code_le == (CodeLineElement *)0x0) {
            if ((url_le != (UrlLineElement *)0x0) &&
               (iVar4 = (**(code **)(*(long *)l + 8))(), iVar4 != 0xb)) {
              std::operator<<((ostream *)p,"</code>");
            }
          }
          else {
            std::operator<<((ostream *)p,"</i>");
          }
        }
        else {
          std::operator<<((ostream *)p,"</b>");
        }
      }
      else {
        std::operator<<((ostream *)p,"</a>");
      }
    }
    uVar3 = (**(code **)(*(long *)l + 8))();
    switch(uVar3) {
    case 1:
      poVar5 = std::operator<<((ostream *)p,"</h1>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      break;
    case 2:
      poVar5 = std::operator<<((ostream *)p,"</h2>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      break;
    case 3:
      poVar5 = std::operator<<((ostream *)p,"</h3>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      break;
    default:
      poVar5 = std::operator<<((ostream *)p,"</p>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      break;
    case 7:
      poVar5 = std::operator<<((ostream *)p,"</li>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      uVar6 = Paragraph::last();
      if ((uVar6 & 1) != 0) {
        poVar5 = std::operator<<((ostream *)p,"</ol>");
        pvVar8 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        i._4_1_ = 0;
      }
      break;
    case 8:
      poVar5 = std::operator<<((ostream *)p,"</li>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      uVar6 = Paragraph::last();
      if ((uVar6 & 1) != 0) {
        poVar5 = std::operator<<((ostream *)p,"</ul>");
        pvVar8 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        i._5_1_ = 0;
      }
      break;
    case 10:
      std::ostream::operator<<(p,std::endl<char,std::char_traits<char>>);
      uVar6 = Paragraph::last();
      if ((uVar6 & 1) != 0) {
        poVar5 = std::operator<<((ostream *)p,"</blockquote>");
        pvVar8 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        i._6_1_ = 0;
      }
      break;
    case 0xb:
      std::ostream::operator<<(p,std::endl<char,std::char_traits<char>>);
      uVar6 = Paragraph::last();
      if ((uVar6 & 1) != 0) {
        poVar5 = std::operator<<((ostream *)p,"</code>");
        pvVar8 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        i._7_1_ = 0;
      }
    }
  }
  if ((this->field_0x8 & 1) != 0) {
    poVar5 = std::operator<<((ostream *)p,"</body>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)p,"</html>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void HtmlDisplayDriver::display(Document *doc, ostream & output) {
	Paragraph *p = nullptr;
	LineElement *l = nullptr;

	BoldLineElement *bold_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	CodeLineElement *code_le(nullptr);
	UrlLineElement *url_le(nullptr);

	bool is_verbatim(false), 
		 is_quotation(false),
		 is_ulist(false),
		 is_olist(false);

	if (_standalone) {
		output << "<!doctype html>" << endl;
		output << "<html lang=\"fr\">" << endl;
		output << "<head>" << endl;
		output << "<meta charset=\"utf-8\">" << endl;
		output << "<title>mdl generated HTML page</title>" << endl;
		output << "</head>" << endl;
		output << "<body>" << endl;
	}

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << "<h1>";
				break;
			case Paragraph::Level::Title2:
				output << "<h2>";
				break;
			case Paragraph::Level::Title3:
				output << "<h3>";
				break;
			case Paragraph::Level::Code:
				if (!is_verbatim) {
					output << "<code>" << endl;
					is_verbatim = true;
				}
				break;
			case Paragraph::Level::UList1:
				if (!is_ulist) {
					output << "<ul>" << endl;
					is_ulist = true;
				}
				output << "<li>";
				break;
			case Paragraph::Level::OList1:
				if (!is_olist) {
					output << "<ol>" << endl;
					is_olist = true;
				}
				output << "<li>";
				break;
			case Paragraph::Level::Quote:
				if (!is_quotation) {
					output << "<blockquote>" << endl;
					is_quotation = true;
				}
				break;
			default:
				output << "<p>" << endl;
				break;
		}

		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];

			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);

			if (italic_le) {
				output << "<i>";
			} else if (bold_le) {
				output << "<b>";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
				output << "<code>";
			} else if (url_le) {
				output << "<a href=\"" << url_le->url() << "\">";
			}

			output << l->content();

			if (url_le) {
				output << "</a>";
			} else if (bold_le) {
				output << "</b>";
			} else if (italic_le) {
				output << "</i>";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
				output << "</code>";
			}
		}
		
		switch (p->level()) {
			case Paragraph::Level::Code:
				output << endl;
				if (p->last()) {
					output << "</code>" << endl << endl;
					is_verbatim = false;
				}
				break;
			case Paragraph::Level::Quote:
				output << endl;
				if (p->last()) {
					output << "</blockquote>" << endl << endl;
					is_quotation = false;
				}
				break;
			case Paragraph::Level::UList1:
				output << "</li>" << endl;
				if (p->last()) {
					output << "</ul>" << endl << endl;
					is_ulist = false;
				}
				break;
			case Paragraph::Level::OList1:
				output << "</li>" << endl;
				if (p->last()) {
					output << "</ol>" << endl << endl;
					is_olist = false;
				}
				break;
			case Paragraph::Level::Title1:
				output << "</h1>" << endl;
				break;
			case Paragraph::Level::Title2:
				output << "</h2>" << endl;
				break;
			case Paragraph::Level::Title3:
				output << "</h3>" << endl;
				break;
			default:
				output << "</p>" << endl;
				break;
		}
	}
	if (_standalone) {
		output << "</body>" << endl;
		output << "</html>" << endl;
	}
}